

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

void pi_destroy_v2(opj_pi_iterator_t *p_pi,OPJ_UINT32 p_nb_elements)

{
  opj_pi_iterator_t *l_current_pi;
  opj_pi_resolution_t **ppoVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  opj_pi_iterator_t *poVar4;
  
  if (p_pi != (opj_pi_iterator_t *)0x0) {
    if (p_pi->include != (short *)0x0) {
      free(p_pi->include);
      p_pi->include = (short *)0x0;
    }
    if (p_nb_elements != 0) {
      OVar3 = 0;
      poVar4 = p_pi;
      do {
        if (poVar4->comps != (opj_pi_comp_t *)0x0) {
          if (poVar4->numcomps != 0) {
            ppoVar1 = &poVar4->comps->resolutions;
            uVar2 = 0;
            do {
              if (*ppoVar1 != (opj_pi_resolution_t *)0x0) {
                free(*ppoVar1);
                *ppoVar1 = (opj_pi_resolution_t *)0x0;
              }
              uVar2 = uVar2 + 1;
              ppoVar1 = ppoVar1 + 3;
            } while (uVar2 < (uint)poVar4->numcomps);
          }
          free(poVar4->comps);
          poVar4->comps = (opj_pi_comp_t *)0x0;
        }
        poVar4 = poVar4 + 1;
        OVar3 = OVar3 + 1;
      } while (OVar3 != p_nb_elements);
    }
    free(p_pi);
    return;
  }
  return;
}

Assistant:

void pi_destroy_v2(
				opj_pi_iterator_t *p_pi,
				OPJ_UINT32 p_nb_elements)
{
	OPJ_UINT32 compno, pino;
	opj_pi_iterator_t *l_current_pi = p_pi;
	if
		(p_pi)
	{
		if
			(p_pi->include)
		{
			opj_free(p_pi->include);
			p_pi->include = 00;
		}
		// TODO
		for
			(pino = 0; pino < p_nb_elements; ++pino)
		{
			if
				(l_current_pi->comps)
			{
				opj_pi_comp_t *l_current_component = l_current_pi->comps;
				for
					(compno = 0; compno < l_current_pi->numcomps; compno++)
				{
					if
						(l_current_component->resolutions)
					{
						opj_free(l_current_component->resolutions);
						l_current_component->resolutions = 00;
					}
					++l_current_component;
				}
				opj_free(l_current_pi->comps);
				l_current_pi->comps = 0;
			}
			++l_current_pi;
		}
		opj_free(p_pi);
	}
}